

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O3

void __thiscall
HFactor::ftranCall(HFactor *this,HVector *vector,double expected_density,
                  HighsTimerClock *factor_timer_clock_pointer)

{
  int iVar1;
  
  iVar1 = vector->count;
  if (factor_timer_clock_pointer != (HighsTimerClock *)0x0) {
    HighsTimer::start(factor_timer_clock_pointer->timer_pointer_,
                      (factor_timer_clock_pointer->clock_).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[5]);
  }
  ftranL(this,vector,expected_density,factor_timer_clock_pointer);
  ftranU(this,vector,expected_density,factor_timer_clock_pointer);
  if (-1 < iVar1) {
    HVectorBase<double>::reIndex(vector);
  }
  if (factor_timer_clock_pointer != (HighsTimerClock *)0x0) {
    HighsTimer::stop(factor_timer_clock_pointer->timer_pointer_,
                     (factor_timer_clock_pointer->clock_).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[5]);
    return;
  }
  return;
}

Assistant:

void HFactor::ftranCall(HVector& vector, const double expected_density,
                        HighsTimerClock* factor_timer_clock_pointer) const {
  const bool use_indices = vector.count >= 0;
  FactorTimer factor_timer;
  factor_timer.start(FactorFtran, factor_timer_clock_pointer);
  ftranL(vector, expected_density, factor_timer_clock_pointer);
  ftranU(vector, expected_density, factor_timer_clock_pointer);
  // Possibly find the indices in order
  if (use_indices) vector.reIndex();
  factor_timer.stop(FactorFtran, factor_timer_clock_pointer);
}